

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

Var Js::JavascriptPromise::EntryAll(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  anon_class_64_8_4c3b2bf8 handler;
  RecyclableObject *exceptionObject;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values_00;
  undefined4 *puVar5;
  Recycler *pRVar6;
  Var pvVar7;
  JavascriptException *err;
  RecyclableObject *local_120;
  RecyclableObject *resolveFunc;
  Var resolveVar;
  RecyclableObject *iterator;
  JavascriptExceptionObject *exception;
  undefined8 local_f8;
  TrackAllocData local_f0;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *local_c8;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *remainingElementsWrapper;
  JavascriptArray *values;
  RecyclableObject *pRStack_b0;
  uint32 index;
  RecyclableObject *constructorObject;
  JavascriptPromiseCapability *promiseCapability;
  Var iterable;
  JavascriptLibrary *library;
  Var local_80;
  Var constructor;
  undefined1 local_70 [8];
  AutoTagNativeLibraryEntry __tag;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values_00 = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values_00 + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x8f,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values_00);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x90,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  __tag.entry.next = (Entry *)RecyclableObject::GetScriptContext(function);
  constructor = function_local;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_70,function,(CallInfo)function_local,L"Promise.all",
             &stack0x00000000);
  local_80 = Arguments::operator[]((Arguments *)&scriptContext,0);
  BVar3 = Js::JavascriptOperators::IsObject(local_80);
  if (BVar3 == 0) {
    JavascriptError::ThrowTypeError((ScriptContext *)__tag.entry.next,-0x7ff5ec41,L"Promise.all");
  }
  iterable = ScriptContext::GetLibrary((ScriptContext *)__tag.entry.next);
  if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
    promiseCapability =
         (JavascriptPromiseCapability *)
         JavascriptLibraryBase::GetUndefined((JavascriptLibraryBase *)iterable);
  }
  else {
    promiseCapability =
         (JavascriptPromiseCapability *)Arguments::operator[]((Arguments *)&scriptContext,1);
  }
  constructorObject =
       (RecyclableObject *)NewPromiseCapability(local_80,(ScriptContext *)__tag.entry.next);
  pRStack_b0 = VarTo<Js::RecyclableObject>(local_80);
  values._4_4_ = 0;
  remainingElementsWrapper =
       (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)0x0;
  pRVar6 = ScriptContext::GetRecycler((ScriptContext *)__tag.entry.next);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_f0,
             (type_info *)
             &JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
             ,0xba);
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_f0);
  exception = (JavascriptExceptionObject *)Memory::Recycler::AllocZeroInlined;
  local_f8 = 0;
  local_c8 = (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)
             new<Memory::Recycler>(4,pRVar6,0x744a10);
  local_c8->remainingElements = 1;
  iterator = (RecyclableObject *)0x0;
  resolveVar = Js::JavascriptOperators::GetIterator
                         (promiseCapability,(ScriptContext *)__tag.entry.next,false);
  resolveFunc = (RecyclableObject *)
                Js::JavascriptOperators::GetProperty
                          (pRStack_b0,0x134,(ScriptContext *)__tag.entry.next,
                           (PropertyValueInfo *)0x0);
  bVar2 = JavascriptConversion::IsCallable(resolveFunc);
  if (!bVar2) {
    JavascriptError::ThrowTypeError((ScriptContext *)__tag.entry.next,-0x7ff5ec76,(PCWSTR)0x0);
  }
  local_120 = VarTo<Js::RecyclableObject>(resolveFunc);
  remainingElementsWrapper =
       (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)
       JavascriptLibrary::CreateArray((JavascriptLibrary *)iterable,0);
  handler.resolveFunc = &local_120;
  handler.scriptContext = (ScriptContext **)&__tag.entry.next;
  handler.constructorObject = &stack0xffffffffffffff50;
  handler.library = (JavascriptLibrary **)&iterable;
  handler.index = (uint32 *)((long)&values + 4);
  handler.values = (JavascriptArray **)&remainingElementsWrapper;
  handler.promiseCapability = (JavascriptPromiseCapability **)&constructorObject;
  handler.remainingElementsWrapper = &local_c8;
  Js::JavascriptOperators::
  DoIteratorStepAndValue<Js::JavascriptPromise::EntryAll(Js::RecyclableObject*,Js::CallInfo,___)::__0>
            ((RecyclableObject *)resolveVar,(ScriptContext *)__tag.entry.next,handler);
  local_c8->remainingElements = local_c8->remainingElements - 1;
  if (local_c8->remainingElements == 0) {
    if (remainingElementsWrapper ==
        (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                  ,0xfd,"(values != nullptr)","values != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pvVar7 = JavascriptPromiseCapability::GetResolve
                       ((JavascriptPromiseCapability *)constructorObject);
    TryCallResolveOrRejectHandler(pvVar7,remainingElementsWrapper,(ScriptContext *)__tag.entry.next)
    ;
  }
  exceptionObject = iterator;
  if (iterator != (RecyclableObject *)0x0) {
    pvVar7 = JavascriptPromiseCapability::GetReject
                       ((JavascriptPromiseCapability *)constructorObject);
    TryRejectWithExceptionObject
              ((JavascriptExceptionObject *)exceptionObject,pvVar7,(ScriptContext *)__tag.entry.next
              );
  }
  pvVar7 = JavascriptPromiseCapability::GetPromise((JavascriptPromiseCapability *)constructorObject)
  ;
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_70);
  return pvVar7;
}

Assistant:

Var JavascriptPromise::EntryAll(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Promise.all"));

        // 1. Let C be the this value.
        Var constructor = args[0];

        // 2. If Type(C) is not Object, throw a TypeError exception.
        if (!JavascriptOperators::IsObject(constructor))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Promise.all"));
        }

        JavascriptLibrary* library = scriptContext->GetLibrary();
        Var iterable;

        if (args.Info.Count > 1)
        {
            iterable = args[1];
        }
        else
        {
            iterable = library->GetUndefined();
        }

        // 3. Let promiseCapability be NewPromiseCapability(C).
        JavascriptPromiseCapability* promiseCapability = NewPromiseCapability(constructor, scriptContext);

        // We know that constructor is an object at this point - further, we even know that it is a constructor - because NewPromiseCapability
        // would throw otherwise. That means we can safely cast constructor into a RecyclableObject* now and avoid having to perform ToObject
        // as part of the Invoke operation performed inside the loop below.
        RecyclableObject* constructorObject = VarTo<RecyclableObject>(constructor);

        uint32 index = 0;
        JavascriptArray* values = nullptr;

        // We can't use a simple counter for the remaining element count since each Promise.all Resolve Element Function needs to know how many
        // elements are remaining when it runs and needs to update that counter for all other functions created by this call to Promise.all.
        // We can't just use a static variable, either, since this element count is only used for the Promise.all Resolve Element Functions created
        // by this call to Promise.all.
        JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElementsWrapper = RecyclerNewStructZ(scriptContext->GetRecycler(), JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper);
        remainingElementsWrapper->remainingElements = 1;

        JavascriptExceptionObject* exception = nullptr;
        try
        {
            // 4. Let iterator be GetIterator(iterable).
            RecyclableObject* iterator = JavascriptOperators::GetIterator(iterable, scriptContext);

            Var resolveVar = JavascriptOperators::GetProperty(constructorObject, Js::PropertyIds::resolve, scriptContext);
            if (!JavascriptConversion::IsCallable(resolveVar))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
            }

            RecyclableObject* resolveFunc = VarTo<RecyclableObject>(resolveVar);
            values = library->CreateArray(0);

            JavascriptOperators::DoIteratorStepAndValue(iterator, scriptContext, [&](Var next)
            {
                ThreadContext * threadContext = scriptContext->GetThreadContext();
                Var nextPromise = nullptr;
                BEGIN_SAFE_REENTRANT_CALL(threadContext)
                {
                    nextPromise = CALL_FUNCTION(threadContext,
                                        resolveFunc, Js::CallInfo(CallFlags_Value, 2),
                                        constructorObject,
                                        next);
                }
                END_SAFE_REENTRANT_CALL

                JavascriptPromiseAllResolveElementFunction* resolveElement = library->CreatePromiseAllResolveElementFunction(EntryAllResolveElementFunction, index, values, promiseCapability, remainingElementsWrapper);

                remainingElementsWrapper->remainingElements++;

                RecyclableObject* nextPromiseObject;

                if (!JavascriptConversion::ToObject(nextPromise, scriptContext, &nextPromiseObject))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
                }

                Var thenVar = JavascriptOperators::GetProperty(nextPromiseObject, Js::PropertyIds::then, scriptContext);

                if (!JavascriptConversion::IsCallable(thenVar))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
                }

                RecyclableObject* thenFunc = VarTo<RecyclableObject>(thenVar);

                BEGIN_SAFE_REENTRANT_CALL(threadContext)
                {
                    CALL_FUNCTION(scriptContext->GetThreadContext(),
                        thenFunc, Js::CallInfo(CallFlags_Value, 3),
                        nextPromiseObject,
                        resolveElement,
                        promiseCapability->GetReject());
                }
                END_SAFE_REENTRANT_CALL

                index++;
            });

            remainingElementsWrapper->remainingElements--;
            if (remainingElementsWrapper->remainingElements == 0)
            {
                Assert(values != nullptr);

                TryCallResolveOrRejectHandler(promiseCapability->GetResolve(), values, scriptContext);
            }
        }
        catch (const JavascriptException& err)
        {
            exception = err.GetAndClear();
        }

        if (exception != nullptr)
        {
            TryRejectWithExceptionObject(exception, promiseCapability->GetReject(), scriptContext);
        }

        return promiseCapability->GetPromise();
    }